

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O1

bool __thiscall SGParser::Generator::NFA::Create(NFA *this,NFA *n,uint newLexemeId)

{
  pointer *pppNVar1;
  pointer *ppuVar2;
  pointer ppNVar3;
  iterator iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  bool bVar6;
  uint uVar7;
  mapped_type pNVar8;
  mapped_type *ppNVar9;
  _Base_ptr p_Var10;
  pointer ppNVar11;
  undefined1 local_c0 [8];
  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
  pointerMap;
  NodeSet graph;
  NFANode *local_50;
  NFANode *ptr;
  uint local_3c;
  NFANode *local_38;
  NFANode *igraph;
  
  if ((this->pStartState == (NFANode *)0x0) && (n->pStartState != (NFANode *)0x0)) {
    graph._M_t._M_impl._0_4_ = 0;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&graph;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&graph;
    ptr = (NFANode *)this;
    TraverseGraph(this,n->pStartState,
                  (NodeSet *)&pointerMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&pointerMap;
    pointerMap._M_t._M_impl._0_4_ = 0;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&graph) {
      p_Var10 = graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        local_38 = *(NFANode **)(p_Var10 + 1);
        pNVar8 = (mapped_type)operator_new(0x38);
        (pNVar8->LinkPtr).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar8->LinkPtr).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar8->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar8->LinkPtr).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar8->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar8->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ppNVar9 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)local_c0,&local_38);
        *ppNVar9 = pNVar8;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)&graph);
    }
    local_3c = newLexemeId;
    if (graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&graph) {
      p_Var10 = graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        local_38 = *(NFANode **)(p_Var10 + 1);
        graph._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var10;
        ppNVar9 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)local_c0,&local_38);
        pNVar8 = *ppNVar9;
        pNVar8->AcceptingState = local_38->AcceptingState;
        pNVar8->Id = local_38->Id;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&pNVar8->LinkChar,&local_38->LinkChar);
        ppNVar11 = (local_38->LinkPtr).
                   super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppNVar3 = (local_38->LinkPtr).
                  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppNVar11 != ppNVar3) {
          do {
            local_50 = *ppNVar11;
            ppNVar9 = std::
                      map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                      ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                    *)local_c0,&local_50);
            iVar4._M_current =
                 (pNVar8->LinkPtr).
                 super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (pNVar8->LinkPtr).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
              _M_realloc_insert<SGParser::Generator::NFANode*const&>
                        ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                          *)&pNVar8->LinkPtr,iVar4,ppNVar9);
            }
            else {
              *iVar4._M_current = *ppNVar9;
              pppNVar1 = &(pNVar8->LinkPtr).
                          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppNVar1 = *pppNVar1 + 1;
            }
            ppNVar11 = ppNVar11 + 1;
          } while (ppNVar11 != ppNVar3);
        }
        p_Var10 = (_Base_ptr)
                  std::_Rb_tree_increment
                            ((_Rb_tree_node_base *)
                             graph._M_t._M_impl.super__Rb_tree_header._M_node_count);
      } while (p_Var10 != (_Base_ptr)&graph);
    }
    ppNVar9 = std::
              map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
              ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                            *)local_c0,&n->pStartState);
    (ptr->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = &(*ppNVar9)->Id;
    ppNVar11 = (n->FinalState).
               super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppNVar3 = (n->FinalState).
              super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppNVar11 != ppNVar3) {
      pvVar5 = &ptr->LinkChar;
      do {
        local_38 = *ppNVar11;
        ppNVar9 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)local_c0,&local_38);
        local_50 = *ppNVar9;
        if ((local_3c != 0) && (local_50->AcceptingState != 0)) {
          local_50->AcceptingState = local_3c;
        }
        iVar4._M_current =
             (NFANode **)
             (ptr->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        if (iVar4._M_current ==
            (ptr->LinkPtr).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
          _M_realloc_insert<SGParser::Generator::NFANode*const&>
                    ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                      *)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = local_50;
          ppuVar2 = &(ptr->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *ppuVar2 = *ppuVar2 + 2;
        }
        ppNVar11 = ppNVar11 + 1;
      } while (ppNVar11 != ppNVar3);
    }
    uVar7 = local_3c;
    if (local_3c == 0) {
      uVar7 = n->LexemeId;
    }
    ptr->Id = uVar7;
    std::
    _Rb_tree<SGParser::Generator::NFANode_*,_std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>,_std::_Select1st<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
    ::~_Rb_tree((_Rb_tree<SGParser::Generator::NFANode_*,_std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>,_std::_Select1st<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                 *)local_c0);
    std::
    _Rb_tree<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::_Identity<SGParser::Generator::NFANode_*>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
    ::~_Rb_tree((_Rb_tree<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::_Identity<SGParser::Generator::NFANode_*>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                 *)&pointerMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool NFA::Create(const NFA& n, unsigned newLexemeId) {
    // Make sure this NFA is empty
    if (pStartState)
        return false;
    // Can't copy an empty NFA
    if (!n.pStartState)
        return false;

    // Make a list of all nodes in n
    NodeSet graph;

    TraverseGraph(n.pStartState, graph);

    // Make a new node in this graph for all these nodes. Make a hash
    // that maps from the old pointer address to the new pointer address
    std::map<NFANode*, NFANode*> pointerMap;

    for (const auto igraph : graph)
        pointerMap[igraph] = new NFANode;

    // Go through all of the nodes in the old graph and copy them to
    // the new graph. Translate the pointers in the LinkPtr field
    // using the pointerMap created above
    for (const auto n1 : graph) {
        const auto n2 = pointerMap[n1];

        n2->AcceptingState = n1->AcceptingState;
        n2->Id             = n1->Id;
        n2->LinkChar       = n1->LinkChar;

        for (const auto ptr : n1->LinkPtr)
            n2->LinkPtr.push_back(pointerMap[ptr]);
    }

    // Set the start node equal to n1's start node
    pStartState = pointerMap[n.pStartState];

    // Copy/translate the final state std::vector
    for (const auto fs : n.FinalState) {
        const auto ptr = pointerMap[fs];

        if (newLexemeId && ptr->AcceptingState)
            ptr->AcceptingState = newLexemeId;

        FinalState.push_back(ptr);
    }

    LexemeId = newLexemeId ? newLexemeId : n.LexemeId;

    return true;
}